

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::Marray<short,_std::allocator<unsigned_long>_>::Marray
          (Marray<short,_std::allocator<unsigned_long>_> *this,
          Marray<short,_std::allocator<unsigned_long>_> *in)

{
  size_t sVar1;
  short *__dest;
  unsigned_long *__dest_00;
  size_t sVar2;
  runtime_error *this_00;
  
  (this->super_View<short,_false,_std::allocator<unsigned_long>_>).data_ = (pointer)0x0;
  (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.shape_ = (size_t *)0x0;
  (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.shapeStrides_ =
       (size_t *)0x0;
  (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.strides_ =
       (size_t *)0x0;
  (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_ = 0;
  (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.size_ = 0;
  (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.coordinateOrder_ =
       LastMajorOrder;
  (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_ = true;
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&this->super_View<short,_false,_std::allocator<unsigned_long>_>);
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            (&in->super_View<short,_false,_std::allocator<unsigned_long>_>);
  if ((in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_ == false) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    if ((in->super_View<short,_false,_std::allocator<unsigned_long>_>).data_ == (pointer)0x0) {
      (this->super_View<short,_false,_std::allocator<unsigned_long>_>).data_ = (pointer)0x0;
    }
    else {
      __dest = __gnu_cxx::new_allocator<short>::allocate
                         ((new_allocator<short> *)&this->field_0x40,
                          (in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.
                          size_,(void *)0x0);
      (this->super_View<short,_false,_std::allocator<unsigned_long>_>).data_ = __dest;
      memcpy(__dest,(in->super_View<short,_false,_std::allocator<unsigned_long>_>).data_,
             (in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.size_ * 2);
    }
    if (in != this) {
      sVar2 = (in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_;
      __dest_00 = (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.shape_;
      sVar1 = (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_;
      if (sVar2 != sVar1) {
        operator_delete(__dest_00,sVar1 * 0x18);
        sVar2 = (in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_;
        (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_ =
             sVar2;
        __dest_00 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                              ((new_allocator<unsigned_long> *)
                               &(this->super_View<short,_false,_std::allocator<unsigned_long>_>).
                                geometry_,sVar2 * 3,(void *)0x0);
        (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.shape_ =
             __dest_00;
        sVar2 = (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.
                dimension_;
        (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.shapeStrides_ =
             __dest_00 + sVar2;
        (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.strides_ =
             __dest_00 + sVar2 + sVar2;
        sVar2 = (in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_;
        (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.dimension_ =
             sVar2;
      }
      memcpy(__dest_00,
             (in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.shape_,
             sVar2 * 0x18);
      (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.size_ =
           (in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.size_;
      (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.coordinateOrder_ =
           (in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.coordinateOrder_
      ;
      (this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_ =
           (in->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_;
    }
    View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
              (&this->super_View<short,_false,_std::allocator<unsigned_long>_>);
    if ((this->super_View<short,_false,_std::allocator<unsigned_long>_>).geometry_.isSimple_ !=
        false) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    const Marray<T, A>& in
)
:   dataAllocator_(in.dataAllocator_) 
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }
    if(in.data_ == 0) {
        this->data_ = 0;
    }
    else {
        this->data_ = dataAllocator_.allocate(in.size());
        memcpy(this->data_, in.data_, (in.size())*sizeof(T));
    }
    this->geometry_ = in.geometry_;
    testInvariant();
}